

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd_common.h
# Opt level: O0

float_type
b(uintmax_t dist_from_border,uintmax_t CPML_region_width,float_type dt,float_type alpha_max,
 float_type sigma_max)

{
  double dVar1;
  double in_XMM0_Qa;
  float_type fVar2;
  float_type fVar3;
  float_type fVar4;
  uintmax_t in_XMM1_Qa;
  float_type in_XMM2_Qa;
  
  dVar1 = -in_XMM0_Qa;
  fVar2 = sigma((uintmax_t)in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
  fVar3 = Kappa((uintmax_t)in_XMM2_Qa,(uintmax_t)dVar1);
  fVar4 = alpha((uintmax_t)in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa);
  dVar1 = exp(dVar1 * (fVar2 / (fVar3 * 8.85418781762039e-12) + fVar4 / 8.85418781762039e-12));
  return dVar1;
}

Assistant:

inline float_type b(uintmax_t dist_from_border, uintmax_t CPML_region_width,
                    float_type dt, float_type alpha_max, float_type sigma_max) {
  return exp(-dt *
             (sigma(dist_from_border, CPML_region_width, sigma_max) /
                  (eps0 * Kappa(dist_from_border, CPML_region_width)) +
              alpha(dist_from_border, CPML_region_width, alpha_max) / eps0));
}